

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_eval.c
# Opt level: O2

l2_expr_info *
l2_eval_expr_comma1(l2_expr_info *__return_storage_ptr__,l2_scope *scope_p,
                   l2_expr_info left_expr_info)

{
  boolean bVar1;
  l2_expr_info local_60 [2];
  
  while( true ) {
    bVar1 = l2_parse_probe_next_token_by_type(L2_TOKEN_COMMA);
    if (bVar1 == '\0') break;
    l2_parse_token_forward();
    l2_eval_expr_assign(local_60,scope_p);
    left_expr_info.val.procedure.upper_scope_p = (l2_scope *)local_60[0].val.procedure.upper_scope_p
    ;
    left_expr_info.val_type = local_60[0].val_type;
    left_expr_info._4_4_ = local_60[0]._4_4_;
    left_expr_info.val.real = (double)local_60[0].val.real;
  }
  (__return_storage_ptr__->val).procedure.upper_scope_p = left_expr_info.val.procedure.upper_scope_p
  ;
  __return_storage_ptr__->val_type = left_expr_info.val_type;
  *(undefined4 *)&__return_storage_ptr__->field_0x4 = left_expr_info._4_4_;
  (__return_storage_ptr__->val).real = left_expr_info.val.real;
  return __return_storage_ptr__;
}

Assistant:

l2_expr_info l2_eval_expr_comma1(l2_scope *scope_p, l2_expr_info left_expr_info) {
    _if_type (L2_TOKEN_COMMA)
    {
        l2_expr_info right_expr_p;
        right_expr_p = l2_eval_expr_assign(scope_p);
        return l2_eval_expr_comma1(scope_p, right_expr_p);
    }
    _else
    {
        return left_expr_info;
    }
}